

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Spc_Dsp.cpp
# Opt level: O2

void __thiscall Spc_Dsp::set_output(Spc_Dsp *this,sample_t_conflict1 *out,int size)

{
  sample_t_conflict1 *psVar1;
  long lVar2;
  
  psVar1 = (this->m).extra;
  if (out != (sample_t_conflict1 *)0x0) {
    psVar1 = out;
  }
  (this->m).out_begin = psVar1;
  (this->m).out = psVar1;
  lVar2 = 0x10;
  if (out != (sample_t_conflict1 *)0x0) {
    lVar2 = (long)size;
  }
  (this->m).out_end = psVar1 + lVar2;
  return;
}

Assistant:

void Spc_Dsp::set_output( sample_t* out, int size )
{
	require( (size & 1) == 0 ); // must be even
	if ( !out )
	{
		out  = m.extra;
		size = extra_size;
	}
	m.out_begin = out;
	m.out       = out;
	m.out_end   = out + size;
}